

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::InitializeFromObjForObject
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string struct_var;
  string struct_object;
  
  (*(this->namer_).super_Namer._vptr_Namer[7])(&struct_var,&this->namer_,struct_def);
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&struct_object,&this->namer_,struct_def);
  GenIndents_abi_cxx11_(&local_e0,this,1);
  std::operator+(&local_c0,&local_e0,"@classmethod");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  GenIndents_abi_cxx11_(&local_a0,this,1);
  std::operator+(&local_80,&local_a0,"def InitFromObj(cls, ");
  std::operator+(&local_e0,&local_80,&struct_var);
  std::operator+(&local_c0,&local_e0,"):");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  GenIndents_abi_cxx11_(&local_a0,this,2);
  std::operator+(&local_80,&local_a0,"x = ");
  std::operator+(&local_e0,&local_80,&struct_object);
  std::operator+(&local_c0,&local_e0,"()");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  GenIndents_abi_cxx11_(&local_a0,this,2);
  std::operator+(&local_80,&local_a0,"x._UnPack(");
  std::operator+(&local_e0,&local_80,&struct_var);
  std::operator+(&local_c0,&local_e0,")");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  GenIndents_abi_cxx11_(&local_e0,this,2);
  std::operator+(&local_c0,&local_e0,"return x");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::~string((string *)&struct_object);
  std::__cxx11::string::~string((string *)&struct_var);
  return;
}

Assistant:

void InitializeFromObjForObject(const StructDef &struct_def,
                                  std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto struct_var = namer_.Variable(struct_def);
    const auto struct_object = namer_.ObjectType(struct_def);

    code += GenIndents(1) + "@classmethod";
    code += GenIndents(1) + "def InitFromObj(cls, " + struct_var + "):";
    code += GenIndents(2) + "x = " + struct_object + "()";
    code += GenIndents(2) + "x._UnPack(" + struct_var + ")";
    code += GenIndents(2) + "return x";
    code += "\n";
  }